

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

raw_ostream * __thiscall llvm::raw_ostream::indent(raw_ostream *this,uint NumSpaces)

{
  size_t in_RCX;
  void *__buf;
  
  if (NumSpaces < 0x50) {
    write(this,0xe8bd10,(void *)(ulong)NumSpaces,in_RCX);
  }
  else {
    for (; NumSpaces != 0; NumSpaces = NumSpaces - (int)__buf) {
      __buf = (void *)0x4f;
      if (NumSpaces < 0x4f) {
        __buf = (void *)(ulong)NumSpaces;
      }
      write(this,0xe8bd10,__buf,in_RCX);
    }
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::indent(unsigned NumSpaces) {
  return write_padding<' '>(*this, NumSpaces);
}